

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::GetSafetyAmpDisable(AmpIO *this,uint index)

{
  uint32_t uVar1;
  bool bVar2;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x514c4131) {
      bVar2 = (this->ReadBuffer[1] >> (index & 0x1f) & 1) != 0;
    }
    else {
      uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (uVar1 == 0x44514c41) {
        bVar2 = (bool)((*(byte *)((long)this->ReadBuffer +
                                 (ulong)(index + this->MOTOR_STATUS_OFFSET) * 4 + 2) & 2) >> 1);
      }
      else {
        bVar2 = false;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool AmpIO::GetSafetyAmpDisable(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret = false;
    if (GetHardwareVersion() == QLA1_String) {
        ret = GetStatus() & (1 << index);
    }
    else if (GetHardwareVersion() == DQLA_String) {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_SAFETY_DIS;
    }
    return ret;
}